

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

int vkt::tessellation::getClampedRoundedTessLevel(SpacingMode mode,float tessLevel)

{
  int iVar1;
  float clampedTessLevel;
  float tessLevel_local;
  SpacingMode mode_local;
  
  clampedTessLevel = getClampedTessLevel(mode,tessLevel);
  iVar1 = getRoundedTessLevel(mode,clampedTessLevel);
  return iVar1;
}

Assistant:

int getClampedRoundedTessLevel (const SpacingMode mode, const float tessLevel)
{
	return getRoundedTessLevel(mode, getClampedTessLevel(mode, tessLevel));
}